

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Net *_net,size_t blob_count)

{
  Net *pNVar1;
  Allocator *pAVar2;
  Allocator *pAVar3;
  undefined3 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  ExtractorPrivate *pEVar40;
  
  this->_vptr_Extractor = (_func_int **)&PTR__Extractor_0052f3e8;
  pEVar40 = (ExtractorPrivate *)operator_new(0x60);
  ExtractorPrivate::ExtractorPrivate(pEVar40,_net);
  this->d = pEVar40;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&pEVar40->blob_mats,blob_count);
  pEVar40 = this->d;
  pNVar1 = pEVar40->net;
  uVar4 = *(undefined3 *)&(pNVar1->opt).field_0x1;
  iVar5 = (pNVar1->opt).num_threads;
  pAVar2 = (pNVar1->opt).blob_allocator;
  pAVar3 = (pNVar1->opt).workspace_allocator;
  iVar6 = (pNVar1->opt).openmp_blocktime;
  bVar7 = (pNVar1->opt).use_winograd_convolution;
  bVar8 = (pNVar1->opt).use_sgemm_convolution;
  bVar9 = (pNVar1->opt).use_int8_inference;
  bVar10 = (pNVar1->opt).use_vulkan_compute;
  bVar11 = (pNVar1->opt).use_bf16_storage;
  bVar12 = (pNVar1->opt).use_fp16_packed;
  bVar13 = (pNVar1->opt).use_fp16_storage;
  bVar14 = (pNVar1->opt).use_fp16_arithmetic;
  bVar15 = (pNVar1->opt).use_int8_packed;
  bVar16 = (pNVar1->opt).use_int8_storage;
  bVar17 = (pNVar1->opt).use_int8_arithmetic;
  bVar18 = (pNVar1->opt).use_packing_layout;
  bVar19 = (pNVar1->opt).use_shader_pack8;
  bVar20 = (pNVar1->opt).use_subgroup_basic;
  bVar21 = (pNVar1->opt).use_subgroup_vote;
  bVar22 = (pNVar1->opt).use_subgroup_ballot;
  bVar23 = (pNVar1->opt).use_subgroup_shuffle;
  bVar24 = (pNVar1->opt).use_image_storage;
  bVar25 = (pNVar1->opt).use_tensor_storage;
  bVar26 = (pNVar1->opt).use_reserved_0;
  iVar27 = (pNVar1->opt).flush_denormals;
  bVar28 = (pNVar1->opt).use_local_pool_allocator;
  bVar29 = (pNVar1->opt).use_shader_local_memory;
  bVar30 = (pNVar1->opt).use_cooperative_matrix;
  bVar31 = (pNVar1->opt).use_winograd23_convolution;
  bVar32 = (pNVar1->opt).use_winograd43_convolution;
  bVar33 = (pNVar1->opt).use_winograd63_convolution;
  bVar34 = (pNVar1->opt).use_reserved_6;
  bVar35 = (pNVar1->opt).use_reserved_7;
  bVar36 = (pNVar1->opt).use_reserved_8;
  bVar37 = (pNVar1->opt).use_reserved_9;
  bVar38 = (pNVar1->opt).use_reserved_10;
  bVar39 = (pNVar1->opt).use_reserved_11;
  (pEVar40->opt).lightmode = (pNVar1->opt).lightmode;
  *(undefined3 *)&(pEVar40->opt).field_0x1 = uVar4;
  (pEVar40->opt).num_threads = iVar5;
  (pEVar40->opt).blob_allocator = pAVar2;
  (pEVar40->opt).workspace_allocator = pAVar3;
  (pEVar40->opt).openmp_blocktime = iVar6;
  (pEVar40->opt).use_winograd_convolution = bVar7;
  (pEVar40->opt).use_sgemm_convolution = bVar8;
  (pEVar40->opt).use_int8_inference = bVar9;
  (pEVar40->opt).use_vulkan_compute = bVar10;
  (pEVar40->opt).use_bf16_storage = bVar11;
  (pEVar40->opt).use_fp16_packed = bVar12;
  (pEVar40->opt).use_fp16_storage = bVar13;
  (pEVar40->opt).use_fp16_arithmetic = bVar14;
  (pEVar40->opt).use_int8_packed = bVar15;
  (pEVar40->opt).use_int8_storage = bVar16;
  (pEVar40->opt).use_int8_arithmetic = bVar17;
  (pEVar40->opt).use_packing_layout = bVar18;
  (pEVar40->opt).use_shader_pack8 = bVar19;
  (pEVar40->opt).use_subgroup_basic = bVar20;
  (pEVar40->opt).use_subgroup_vote = bVar21;
  (pEVar40->opt).use_subgroup_ballot = bVar22;
  (pEVar40->opt).use_subgroup_shuffle = bVar23;
  (pEVar40->opt).use_image_storage = bVar24;
  (pEVar40->opt).use_tensor_storage = bVar25;
  (pEVar40->opt).use_reserved_0 = bVar26;
  (pEVar40->opt).flush_denormals = iVar27;
  (pEVar40->opt).use_local_pool_allocator = bVar28;
  (pEVar40->opt).use_shader_local_memory = bVar29;
  (pEVar40->opt).use_cooperative_matrix = bVar30;
  (pEVar40->opt).use_winograd23_convolution = bVar31;
  (pEVar40->opt).use_winograd43_convolution = bVar32;
  (pEVar40->opt).use_winograd63_convolution = bVar33;
  (pEVar40->opt).use_reserved_6 = bVar34;
  (pEVar40->opt).use_reserved_7 = bVar35;
  (pEVar40->opt).use_reserved_8 = bVar36;
  (pEVar40->opt).use_reserved_9 = bVar37;
  (pEVar40->opt).use_reserved_10 = bVar38;
  (pEVar40->opt).use_reserved_11 = bVar39;
  return;
}

Assistant:

Extractor::Extractor(const Net* _net, size_t blob_count)
    : d(new ExtractorPrivate(_net))
{
    d->blob_mats.resize(blob_count);
    d->opt = d->net->opt;

#if NCNN_VULKAN
    if (d->net->opt.use_vulkan_compute)
    {
        d->local_blob_vkallocator = 0;
        d->local_staging_vkallocator = 0;

        d->blob_mats_gpu.resize(blob_count);
        d->blob_mats_gpu_image.resize(blob_count);
    }
#endif // NCNN_VULKAN
}